

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O1

void plot_masked_sprite_16px(tgestate_t *state,vischar_t *vischar)

{
  uint8_t uVar1;
  uint8_t *puVar2;
  uint8_t *puVar3;
  byte *pbVar4;
  byte x;
  ulong uVar5;
  byte bVar6;
  byte bVar7;
  long lVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  ulong uVar15;
  byte bVar16;
  byte *pbVar17;
  
  x = (byte)(vischar->isopos).x & 7;
  if (x < 4) {
    plot_masked_sprite_16px_right(state,x);
    return;
  }
  bVar7 = x - 4;
  puVar2 = state->bitmap_pointer;
  puVar3 = state->mask_pointer;
  uVar1 = (state->spriteplotter).height_16_right;
  lVar8 = 0;
  do {
    bVar12 = puVar2[lVar8 * 2];
    bVar9 = puVar2[lVar8 * 2 + 1];
    bVar10 = puVar3[lVar8 * 2];
    bVar14 = puVar3[lVar8 * 2 + 1];
    if ((char)state->sprite_index < '\0') {
      uVar15 = (ulong)bVar12;
      uVar5 = (ulong)bVar10;
      bVar10 = state->reversed[bVar14];
      bVar14 = state->reversed[uVar5];
      bVar12 = state->reversed[bVar9];
      bVar9 = state->reversed[uVar15];
    }
    bVar6 = 0xff;
    bVar13 = bVar14;
    if (x == 4) {
      bVar13 = bVar14 * '\x02' + 1;
      bVar6 = bVar10 >> 7;
      bVar10 = bVar10 * '\x02' | bVar14 >> 7;
      bVar6 = bVar6 | 0xfe;
    }
    bVar16 = bVar10;
    bVar14 = bVar13;
    if (bVar7 < 2) {
      bVar14 = bVar13 * '\x02' + 1;
      bVar16 = bVar10 * '\x02' | bVar13 >> 7;
      bVar6 = bVar6 * '\x02' | bVar10 >> 7;
    }
    bVar13 = bVar16;
    bVar10 = bVar14;
    if (bVar7 < 3) {
      bVar10 = bVar14 * '\x02' + 1;
      bVar13 = bVar16 * '\x02' | bVar14 >> 7;
      bVar6 = bVar6 * '\x02' | bVar16 >> 7;
    }
    bVar14 = bVar13;
    bVar16 = bVar10;
    if (bVar7 < 4) {
      bVar16 = bVar10 * '\x02' + 1;
      bVar14 = bVar13 * '\x02' | bVar10 >> 7;
      bVar6 = bVar6 * '\x02' | bVar13 >> 7;
    }
    if (x == 4) {
      bVar10 = bVar9 * '\x02';
      bVar13 = bVar12 >> 7;
      bVar12 = bVar12 * '\x02' | bVar9 >> 7;
    }
    else {
      bVar13 = 0;
      bVar10 = bVar9;
    }
    bVar11 = bVar12;
    bVar9 = bVar10;
    if (bVar7 < 2) {
      bVar9 = bVar10 * '\x02';
      bVar11 = bVar12 * '\x02' | bVar10 >> 7;
      bVar13 = bVar13 * '\x02' | bVar12 >> 7;
    }
    bVar12 = bVar11;
    bVar10 = bVar9;
    if (bVar7 < 3) {
      bVar10 = bVar9 * '\x02';
      bVar12 = bVar11 * '\x02' | bVar9 >> 7;
      bVar13 = bVar13 * '\x02' | bVar11 >> 7;
    }
    bVar11 = bVar12;
    bVar9 = bVar10;
    if (bVar7 < 4) {
      bVar9 = bVar10 * '\x02';
      bVar11 = bVar12 * '\x02' | bVar10 >> 7;
      bVar13 = bVar13 * '\x02' | bVar12 >> 7;
    }
    pbVar4 = state->foreground_mask_pointer;
    pbVar17 = state->window_buf_pointer;
    if ((state->spriteplotter).enable_16_right_1 != '\0') {
      *pbVar17 = bVar13 & *pbVar4 | (bVar6 | ~*pbVar4) & *pbVar17;
    }
    if ((state->spriteplotter).enable_16_right_2 != '\0') {
      pbVar17[1] = bVar11 & pbVar4[1] | (bVar14 | ~pbVar4[1]) & pbVar17[1];
    }
    pbVar17 = pbVar17 + 2;
    if ((state->spriteplotter).enable_16_right_3 != '\0') {
      *pbVar17 = bVar9 & pbVar4[2] | (bVar16 | ~pbVar4[2]) & *pbVar17;
    }
    state->foreground_mask_pointer = pbVar4 + 4;
    state->window_buf_pointer = pbVar17 + (long)state->columns + -2;
    lVar8 = lVar8 + 1;
  } while (uVar1 != (uint8_t)lVar8);
  return;
}

Assistant:

void plot_masked_sprite_16px(tgestate_t *state, vischar_t *vischar)
{
  uint8_t x; /* was A */

  ASSERT_VISCHAR_VALID(vischar);

  x = vischar->isopos.x & 7;
  if (x < 4)
    plot_masked_sprite_16px_right(state, x); /* was fallthrough */
  else
    plot_masked_sprite_16px_left(state, x);
}